

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

size_t __thiscall
nivalis::util::find_equality
          (util *this,string_view expr,bool allow_ineq,bool enforce_no_adj_comparison)

{
  util uVar1;
  size_t i;
  util *puVar2;
  util *puVar3;
  size_t sVar4;
  util *in_R10;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  sVar4 = expr._M_len;
  if (this == (util *)0x0) {
    return 0xffffffffffffffff;
  }
  lVar5 = 0;
  puVar2 = (util *)0x0;
  do {
    if (this + -1 == puVar2) {
      return 0xffffffffffffffff;
    }
    uVar1 = puVar2[sVar4];
    if (uVar1 == (util)0x28) {
LAB_0010ed6d:
      lVar5 = lVar5 + 1;
    }
    else if (uVar1 == (util)0x29) {
LAB_0010ed72:
      lVar5 = lVar5 + -1;
    }
    else {
      if (uVar1 == (util)0x5b) goto LAB_0010ed6d;
      if ((uVar1 == (util)0x5d) || (uVar1 == (util)0x7d)) goto LAB_0010ed72;
      if (uVar1 == (util)0x7b) goto LAB_0010ed6d;
      if (lVar5 != 0) goto LAB_0010ed75;
      if (uVar1 == (util)0x3d) {
        bVar6 = puVar2 == (util *)0x0;
        puVar3 = puVar2;
        if (bVar6) {
          puVar3 = in_R10;
        }
        bVar7 = !bVar6;
joined_r0x0010edce:
        if (bVar7 && allow_ineq) {
          if ((0x3e < (ulong)(byte)puVar2[sVar4 - 1]) ||
             (puVar3 = in_R10,
             (0x7000000200000000U >> ((ulong)(byte)puVar2[sVar4 - 1] & 0x3f) & 1) == 0)) {
            if (0x3e < (ulong)(byte)puVar2[sVar4 + 1]) {
              return (size_t)puVar2;
            }
            puVar3 = in_R10;
            if ((0x7000000200000000U >> ((ulong)(byte)puVar2[sVar4 + 1] & 0x3f) & 1) == 0) {
              return (size_t)puVar2;
            }
          }
        }
        else if (!bVar6) {
          return (size_t)puVar3;
        }
      }
      else {
        puVar3 = in_R10;
        if ((char)expr._M_str != '\0') {
          bVar7 = ((byte)uVar1 & 0xfd) != 0x3c;
          bVar8 = puVar2 == (util *)0x0;
          bVar6 = bVar8 || bVar7;
          puVar3 = puVar2;
          if (bVar8 || bVar7) {
            puVar3 = in_R10;
          }
          bVar7 = !bVar8 && !bVar7;
          goto joined_r0x0010edce;
        }
      }
      lVar5 = 0;
      in_R10 = puVar3;
    }
LAB_0010ed75:
    puVar2 = puVar2 + 1;
  } while( true );
}

Assistant:

size_t find_equality(std::string_view expr,
        bool allow_ineq,
        bool enforce_no_adj_comparison) {
    if (expr.empty()) return -1;
    size_t stkh = 0;
    for (size_t i = 0; i < expr.size() - 1; ++i) {
        const char c = expr[i];
        if (is_open_bracket(c)) {
            ++stkh;
        } else if (is_close_bracket(c)) {
            --stkh;
        } else if (stkh == 0 &&
                (c == '=' || (allow_ineq && (c == '<' || c== '>')))
                    && i > 0 &&
                   (!enforce_no_adj_comparison ||
                       (!util::is_comp_operator(expr[i-1]) &&
                       expr[i-1] != '!' &&
                       !util::is_comp_operator(expr[i+1]) &&
                       expr[i+1] != '!'))) {
            return i;
        }
    }
    return -1;
}